

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGenerator::GetPredefinedTargetsFolder_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalGenerator *this)

{
  bool bVar1;
  cmake *this_00;
  cmState *this_01;
  string *psVar2;
  allocator<char> local_55 [20];
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue prop;
  cmGlobalGenerator *this_local;
  
  prop.Value = (string *)this;
  this_00 = GetCMakeInstance(this);
  this_01 = cmake::GetState(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"PREDEFINED_TARGETS_FOLDER",&local_41);
  local_20 = cmState::GetGlobalProperty(this_01,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_20);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"CMakePredefinedTargets",local_55);
    std::allocator<char>::~allocator(local_55);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GetPredefinedTargetsFolder() const
{
  cmValue prop = this->GetCMakeInstance()->GetState()->GetGlobalProperty(
    "PREDEFINED_TARGETS_FOLDER");

  if (prop) {
    return *prop;
  }

  return "CMakePredefinedTargets";
}